

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O2

void charls::transform_line<charls::transform_hp2<unsigned_short>::inverse,unsigned_short>
               (triplet<unsigned_short> *destination,triplet<unsigned_short> *source,
               size_t pixel_count,inverse *transform)

{
  triplet<unsigned_short> tVar1;
  long lVar2;
  bool bVar3;
  
  lVar2 = 0;
  while (bVar3 = pixel_count != 0, pixel_count = pixel_count - 1, bVar3) {
    tVar1 = transform_hp2<unsigned_short>::inverse::operator()
                      (transform,(uint)*(ushort *)((long)&source->field_0 + lVar2),
                       (uint)*(ushort *)((long)&source->field_1 + lVar2),
                       (uint)*(ushort *)((long)&source->field_2 + lVar2));
    *(int *)((long)&destination->field_0 + lVar2) = tVar1._0_4_;
    ((anon_union_2_2_7f9ecb7a_for_triplet<unsigned_short>_5 *)((long)&destination->field_2 + lVar2))
    ->v3 = (unsigned_short)tVar1.field_2;
    lVar2 = lVar2 + 6;
  }
  return;
}

Assistant:

void transform_line(triplet<PixelType>* destination, const triplet<PixelType>* source, const size_t pixel_count,
                    Transform& transform) noexcept
{
    for (size_t i{}; i < pixel_count; ++i)
    {
        destination[i] = transform(source[i].v1, source[i].v2, source[i].v3);
    }
}